

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NetIF.hpp
# Opt level: O2

IF_ADDRS_UNICAST gmlc::netif::getNextAddress(int family,IF_ADDRS_UNICAST addrs)

{
  ushort uVar1;
  
  do {
    do {
      addrs = addrs->ifa_next;
      if (addrs == (IF_ADDRS_UNICAST)0x0) {
        return addrs;
      }
    } while (addrs->ifa_addr == (sockaddr *)0x0);
    uVar1 = addrs->ifa_addr->sa_family;
  } while (((uVar1 & 0xfff7) != 2) || ((family & 0xfffffff7U) == 2 && (uint)uVar1 != family));
  return addrs;
}

Assistant:

inline IF_ADDRS_UNICAST getNextAddress(int family, IF_ADDRS_UNICAST addrs)
    {
#if defined(_WIN32) || defined(__USE_W32_SOCKETS)
        (void)family;
        return addrs->Next;
#else
        auto next = addrs->ifa_next;
        while (next != NULL) {
            // Skip entries with a null sockaddr
            auto next_sockaddr = getSockAddr(next);
            if (next_sockaddr == NULL) {
                next = next->ifa_next;
                continue;
            }

            int next_family = next_sockaddr->sa_family;
            // Skip if the family is not IPv4 or IPv6
            if (next_family != AF_INET && next_family != AF_INET6) {
                next = next->ifa_next;
                continue;
            }
            // Skip if a specific IP family was requested and the family doesn't match
            if ((family == AF_INET || family == AF_INET6) && family != next_family) {
                next = next->ifa_next;
                continue;
            }
            // An address entry meeting the requirements was found, return it
            return next;
        }
        return nullptr;
#endif
    }